

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int magma_cipher_init(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  void *__src;
  int in_ECX;
  void *in_RDX;
  byte *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  ossl_gost_cipher_ctx *c;
  byte *in_stack_ffffffffffffffa8;
  gost_ctx *in_stack_ffffffffffffffb0;
  ossl_gost_cipher_ctx *in_stack_ffffffffffffffb8;
  
  lVar2 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  pvVar3 = EVP_CIPHER_CTX_get_app_data(in_RDI);
  if (pvVar3 == (void *)0x0) {
    iVar1 = gost_cipher_set_param
                      (in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    if (iVar1 == 0) {
      return 0;
    }
    pvVar3 = (void *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    EVP_CIPHER_CTX_set_app_data(in_RDI,pvVar3);
    if ((in_ECX != 0) &&
       (iVar1 = init_zero_kdf_seed((uchar *)in_stack_ffffffffffffffb0), iVar1 == 0)) {
      return -1;
    }
  }
  if (in_RSI != (byte *)0x0) {
    magma_key(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    magma_master_key((gost_ctx *)(lVar2 + 0x1c),in_RSI);
  }
  if (in_RDX != (void *)0x0) {
    pvVar3 = (void *)EVP_CIPHER_CTX_original_iv(in_RDI);
    iVar1 = EVP_CIPHER_CTX_get_iv_length(in_RDI);
    memcpy(pvVar3,in_RDX,(long)iVar1);
  }
  pvVar3 = (void *)EVP_CIPHER_CTX_iv_noconst(in_RDI);
  __src = (void *)EVP_CIPHER_CTX_original_iv(in_RDI);
  iVar1 = EVP_CIPHER_CTX_get_iv_length(in_RDI);
  memcpy(pvVar3,__src,(long)iVar1);
  iVar1 = EVP_CIPHER_CTX_get_nid(in_RDI);
  if ((iVar1 == 0x496) || (iVar1 = EVP_CIPHER_CTX_get_nid(in_RDI), iVar1 == 0x497)) {
    *(undefined4 *)(lVar2 + 8) = 0x400;
  }
  else {
    *(undefined4 *)(lVar2 + 8) = 0;
  }
  return 1;
}

Assistant:

static int magma_cipher_init(EVP_CIPHER_CTX *ctx, const unsigned char *key,
                      const unsigned char *iv, int enc)
{
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    /* FIXME this is just initializtion check */
    if (EVP_CIPHER_CTX_get_app_data(ctx) == NULL) {
        if (!gost_cipher_set_param(c, NID_id_tc26_gost_28147_param_Z))
            return 0;
        EVP_CIPHER_CTX_set_app_data(ctx, EVP_CIPHER_CTX_get_cipher_data(ctx));

        if (enc) {
            if (init_zero_kdf_seed(c->kdf_seed) == 0)
                return -1;
        }
    }

    if (key) {
        magma_key(&(c->cctx), key);
        magma_master_key(&(c->cctx), key);
    }
    if (iv) {
        memcpy((unsigned char *)EVP_CIPHER_CTX_original_iv(ctx), iv,
               EVP_CIPHER_CTX_iv_length(ctx));
    }
    memcpy(EVP_CIPHER_CTX_iv_noconst(ctx),
           EVP_CIPHER_CTX_original_iv(ctx), EVP_CIPHER_CTX_iv_length(ctx));

    if (EVP_CIPHER_CTX_nid(ctx) == NID_magma_ctr_acpkm
     || EVP_CIPHER_CTX_nid(ctx) == NID_magma_ctr_acpkm_omac) {
       c->key_meshing = 1024;
    } else {
       c->key_meshing = 0;
    }

    return 1;
}